

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

Stmt * __thiscall kratos::ActiveVisitor::get_reset_stmt(ActiveVisitor *this,Port *port)

{
  const_iterator cVar1;
  mapped_type *ppSVar2;
  mapped_type pSVar3;
  Port *local_18;
  Port *port_local;
  
  local_18 = port;
  cVar1 = std::
          _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->reset_stmt_)._M_h,&local_18);
  if (cVar1.super__Node_iterator_base<std::pair<kratos::Port_*const,_kratos::Stmt_*>,_false>._M_cur
      == (__node_type *)0x0) {
    pSVar3 = (Stmt *)0x0;
  }
  else {
    ppSVar2 = std::__detail::
              _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_kratos::Stmt_*>,_std::allocator<std::pair<kratos::Port_*const,_kratos::Stmt_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->reset_stmt_,&local_18);
    pSVar3 = *ppSVar2;
  }
  return pSVar3;
}

Assistant:

Stmt* get_reset_stmt(Port* port) const {
        if (reset_stmt_.find(port) != reset_stmt_.end()) return reset_stmt_.at(port);
        return nullptr;
    }